

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  if (action == 1) {
    if (key == 0x20) {
      cur_icon_color = cur_icon_color + ((cur_icon_color + 1U) / 5) * -5 + 1;
      set_icon(window,cur_icon_color);
      return;
    }
    if (key == 0x58) {
      glfwSetWindowIcon(window,0,(GLFWimage *)0x0);
      return;
    }
    if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
        case GLFW_KEY_SPACE:
            cur_icon_color = (cur_icon_color + 1) % 5;
            set_icon(window, cur_icon_color);
            break;
        case GLFW_KEY_X:
            glfwSetWindowIcon(window, 0, NULL);
            break;
    }
}